

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environment.cpp
# Opt level: O1

bool __thiscall DIS::Environment::operator==(Environment *this,Environment *rhs)

{
  return (((this->_padding2 == rhs->_padding2 && rhs->_geometry == this->_geometry) &&
          (rhs->_padding1 == this->_padding1 && rhs->_index == this->_index)) &&
         rhs->_length == this->_length) && this->_environmentType == rhs->_environmentType;
}

Assistant:

bool Environment::operator ==(const Environment& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_environmentType == rhs._environmentType) ) ivarsEqual = false;
     if( ! (_length == rhs._length) ) ivarsEqual = false;
     if( ! (_index == rhs._index) ) ivarsEqual = false;
     if( ! (_padding1 == rhs._padding1) ) ivarsEqual = false;
     if( ! (_geometry == rhs._geometry) ) ivarsEqual = false;
     if( ! (_padding2 == rhs._padding2) ) ivarsEqual = false;

    return ivarsEqual;
 }